

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O0

bool s_try_send<NetAction>(socket_t *socket,NetAction *value,int flags)

{
  string_view payload;
  bool bVar1;
  void *__dest;
  size_t __n;
  undefined4 in_EDX;
  char *in_RSI;
  string msg;
  string local_38 [20];
  int in_stack_ffffffffffffffdc;
  socket_t *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  char *pcVar2;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::resize((ulong)local_38);
  __dest = (void *)std::__cxx11::string::data();
  pcVar2 = in_RSI;
  __n = std::__cxx11::string::size();
  memcpy(__dest,in_RSI,__n);
  std::__cxx11::string::operator_cast_to_basic_string_view(local_38);
  payload._M_len._4_4_ = in_EDX;
  payload._M_len._0_4_ = in_stack_ffffffffffffffe8;
  payload._M_str = pcVar2;
  bVar1 = s_send_raw(in_stack_ffffffffffffffe0,payload,in_stack_ffffffffffffffdc);
  std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool s_try_send(zmq::socket_t *socket, const T &value, int flags = 0) {
    static_assert(is_transferable<T>::value, "Cannot transfer this type");
    std::string msg;
    msg.resize(sizeof(T));
    ::memcpy(msg.data(), &value, msg.size());

    return s_send_raw(socket, std::string_view(msg), flags);
}